

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::~PolyConnectivity(PolyConnectivity *this)

{
  ~PolyConnectivity(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PolyConnectivity() {}